

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O0

vector<float,_std::allocator<float>_> *
irwincolor::lab2xyz(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *lab)

{
  const_reference pvVar1;
  reference pvVar2;
  float fVar3;
  float zn;
  float yn;
  float xn;
  float fz;
  float fx;
  float fy;
  allocator<float> local_1a;
  undefined1 local_19;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *lab_local;
  vector<float,_std::allocator<float>_> *xyz;
  
  local_19 = 0;
  local_18 = lab;
  lab_local = __return_storage_ptr__;
  std::allocator<float>::allocator(&local_1a);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,3,&local_1a);
  std::allocator<float>::~allocator(&local_1a);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
  fz = (*pvVar1 + 16.0) / 116.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
  fVar3 = fz;
  xn = *pvVar1 / 500.0 + fz;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
  yn = fVar3 + *pvVar1 / -200.0;
  fVar3 = labFuncInv(&xn);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,0);
  *pvVar2 = fVar3 * 95.047;
  fVar3 = labFuncInv(&fz);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,1);
  *pvVar2 = fVar3 * 100.0;
  fVar3 = labFuncInv(&yn);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
  *pvVar2 = fVar3 * 108.883;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> lab2xyz(const std::vector<float>& lab)
{
	std::vector<float> xyz(3);
	float fy = (lab[0] + 16.0) / 116.0;
	float fx = lab[1] / 500.0 + fy;
	float fz = fy - lab[2] / 200.0;
	const float xn = 95.047, yn = 100.0, zn = 108.883;
	xyz[0] = labFuncInv(fx) * xn;
	xyz[1] = labFuncInv(fy) * yn;
	xyz[2] = labFuncInv(fz) * zn;
	//std::cout << "lab2xyz: xyz = " << xyz << std::endl;
	return xyz;
}